

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxMemberIdentifier::FxMemberIdentifier
          (FxMemberIdentifier *this,FxExpression *left,FName *name,FScriptPosition *pos)

{
  FName local_14;
  
  FxIdentifier::FxIdentifier(&this->super_FxIdentifier,&local_14,pos);
  (this->super_FxIdentifier).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxMemberIdentifier_00706688;
  this->Object = left;
  (this->super_FxIdentifier).super_FxExpression.ExprType = EFX_MemberIdentifier;
  return;
}

Assistant:

FxMemberIdentifier::FxMemberIdentifier(FxExpression *left, FName name, const FScriptPosition &pos)
	: FxIdentifier(name, pos)
{
	Object = left;
	ExprType = EFX_MemberIdentifier;
}